

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O2

void Cmd_printspans(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  FTextureID FVar2;
  Span *in_RAX;
  char *pcVar3;
  FTexture *pFVar4;
  int x;
  uint uVar5;
  Span *spans;
  
  spans = in_RAX;
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 == 2) {
    pcVar3 = FCommandLine::operator[](argv,1);
    FVar2 = FTextureManager::CheckForTexture(&TexMan,pcVar3,0,1);
    if (FVar2.texnum < 0) {
      pcVar3 = FCommandLine::operator[](argv,1);
      Printf("Unknown texture %s\n",pcVar3);
      return;
    }
    if ((uint)FVar2.texnum < TexMan.Textures.Count) {
      pFVar4 = TexMan.Textures.Array[(uint)FVar2.texnum].Texture;
    }
    else {
      pFVar4 = (FTexture *)0x0;
    }
    for (uVar5 = 0; uVar5 < pFVar4->Width; uVar5 = uVar5 + 1) {
      Printf("%4d:",(ulong)uVar5);
      (*pFVar4->_vptr_FTexture[2])(pFVar4,(ulong)uVar5,&spans);
      while( true ) {
        if (spans->Length == 0) break;
        Printf(" (%4d,%4d)",(ulong)spans->TopOffset,
               (ulong)(((uint)spans->Length + (uint)spans->TopOffset) - 1));
        spans = spans + 1;
      }
      Printf("\n");
    }
  }
  return;
}

Assistant:

CCMD (printspans)
{
	if (argv.argc() != 2)
		return;

	FTextureID picnum = TexMan.CheckForTexture (argv[1], FTexture::TEX_Any);
	if (!picnum.Exists())
	{
		Printf ("Unknown texture %s\n", argv[1]);
		return;
	}
	FTexture *tex = TexMan[picnum];
	for (int x = 0; x < tex->GetWidth(); ++x)
	{
		const FTexture::Span *spans;
		Printf ("%4d:", x);
		tex->GetColumn (x, &spans);
		while (spans->Length != 0)
		{
			Printf (" (%4d,%4d)", spans->TopOffset, spans->TopOffset+spans->Length-1);
			spans++;
		}
		Printf ("\n");
	}
}